

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
clickhouse::SocketHolder::SetTcpKeepAlive(SocketHolder *this,int idle,int intvl,int cnt)

{
  int *in_RDI;
  int val;
  undefined4 local_18;
  undefined1 local_14 [4];
  undefined1 local_10 [4];
  undefined1 local_c [12];
  
  local_18 = 1;
  setsockopt(*in_RDI,1,9,&local_18,4);
  setsockopt(*in_RDI,6,4,local_c,4);
  setsockopt(*in_RDI,6,5,local_10,4);
  setsockopt(*in_RDI,6,6,local_14,4);
  return;
}

Assistant:

void SocketHolder::SetTcpKeepAlive(int idle, int intvl, int cnt) noexcept {
    int val = 1;
    
#if defined(_unix_)
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, &val, sizeof(val));
#   if defined(_linux_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPIDLE, &idle, sizeof(idle));
#   elif defined(_darwin_)
        setsockopt(handle_, IPPROTO_TCP, TCP_KEEPALIVE, &idle, sizeof(idle));
#   else
#       error "platform does not supported"
#   endif
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPINTVL, &intvl, sizeof(intvl));
    setsockopt(handle_, IPPROTO_TCP, TCP_KEEPCNT, &cnt, sizeof(cnt));
#else
    setsockopt(handle_, SOL_SOCKET, SO_KEEPALIVE, (const char*)&val, sizeof(val));
    std::ignore = idle = intvl = cnt;
#endif
}